

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O3

void __thiscall
NoMeEdgeCalculator::NoMeEdgeCalculator
          (NoMeEdgeCalculator *this,double nomeParam,
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *switchRateFS,
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *switchRateRS)

{
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__NoMeEdgeCalculator_001b7eb8;
  (this->switchRateFS)._M_h._M_buckets = &(this->switchRateFS)._M_h._M_single_bucket;
  (this->switchRateFS)._M_h._M_bucket_count = 1;
  (this->switchRateFS)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->switchRateFS)._M_h._M_element_count = 0;
  (this->switchRateFS)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->switchRateFS)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->switchRateFS)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->switchRateRS)._M_h._M_buckets = &(this->switchRateRS)._M_h._M_single_bucket;
  (this->switchRateRS)._M_h._M_bucket_count = 1;
  (this->switchRateRS)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->switchRateRS)._M_h._M_element_count = 0;
  (this->switchRateRS)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->switchRateRS)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->switchRateRS)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->nomeParam = nomeParam;
  if (&this->switchRateFS != switchRateFS) {
    std::
    _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->switchRateFS,&switchRateFS->_M_h);
  }
  if (&this->switchRateRS != switchRateRS) {
    std::
    _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
              ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->switchRateRS,&switchRateRS->_M_h);
  }
  return;
}

Assistant:

NoMeEdgeCalculator::NoMeEdgeCalculator(double nomeParam, std::unordered_map<int, double> switchRateFS, std::unordered_map<int, double> switchRateRS) {
    this->nomeParam = nomeParam;
    this->switchRateFS = switchRateFS;
    this->switchRateRS = switchRateRS;
 }